

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  int iVar1;
  ArrayFeatureType_ArrayDataType AVar2;
  ShapeFlexibilityCase SVar3;
  DefaultOptionalValueCase DVar4;
  int32 value;
  size_t sVar5;
  size_t sVar6;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  ArrayFeatureType *this_local;
  
  data_size = 0;
  sVar5 = google::protobuf::internal::WireFormatLite::Int64Size(&this->shape_);
  if (sVar5 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_shape_cached_byte_size_ = iVar1;
  data_size = sVar5 + data_size;
  AVar2 = datatype(this);
  if (AVar2 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    AVar2 = datatype(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(AVar2);
    data_size = sVar5 + 1 + data_size;
  }
  SVar3 = ShapeFlexibility_case(this);
  if (SVar3 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar3 == kEnumeratedShapes) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                        ((this->ShapeFlexibility_).enumeratedshapes_);
      data_size = sVar5 + 2 + data_size;
    }
    else if (SVar3 == kShapeRange) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureType_ShapeRange>
                        ((this->ShapeFlexibility_).shaperange_);
      data_size = sVar5 + 2 + data_size;
    }
  }
  DVar4 = defaultOptionalValue_case(this);
  if (DVar4 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar4 == kIntDefaultValue) {
      value = intdefaultvalue(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(value);
      data_size = sVar5 + 2 + data_size;
    }
    else if (DVar4 == kFloatDefaultValue) {
      data_size = data_size + 6;
    }
    else if (DVar4 == kDoubleDefaultValue) {
      data_size = data_size + 10;
    }
  }
  iVar1 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar1;
  return data_size;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}